

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindRayGenShader
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,char *pShaderGroupName,
          void *pData,Uint32 DataSize)

{
  RenderDeviceVkImpl *pRVar1;
  bool bVar2;
  undefined4 in_register_0000000c;
  char (*Args_1) [61];
  string msg;
  string local_48;
  
  bVar2 = (DataSize != 0) != (pData == (void *)0x0);
  Args_1 = (char (*) [61])CONCAT71((int7)(CONCAT44(in_register_0000000c,DataSize) >> 8),bVar2);
  if (!bVar2) {
    FormatString<char[26],char[38]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    Args_1 = (char (*) [61])0x90;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
               "BindRayGenShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x90);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((pData != (void *)0x0) && (this->m_ShaderRecordSize != DataSize)) {
    FormatString<char[26],char[61]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",Args_1)
    ;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
               "BindRayGenShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x91);
    std::__cxx11::string::~string((string *)&local_48);
  }
  local_48._M_dataplus._M_p._0_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_RayGenShaderRecord,(ulong)this->m_ShaderRecordStride,
             (value_type_conflict4 *)&local_48);
  PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
            (&((this->m_pPSO).m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
             pShaderGroupName,
             (this->m_RayGenShaderRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)this->m_ShaderRecordStride);
  pRVar1 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  memcpy((this->m_RayGenShaderRecord).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start +
         (pRVar1->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
         ShaderGroupHandleSize,pData,(ulong)DataSize);
  this->m_Changed = true;
  return;
}

Assistant:

BindRayGenShader(const char* pShaderGroupName, const void* pData, Uint32 DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));

        this->m_RayGenShaderRecord.resize(this->m_ShaderRecordStride, Uint8{EmptyElem});
        this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_RayGenShaderRecord.data(), this->m_ShaderRecordStride);

        const Uint32 GroupSize = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        std::memcpy(this->m_RayGenShaderRecord.data() + GroupSize, pData, DataSize);
        this->m_Changed = true;
    }